

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostore.c
# Opt level: O0

int ostore_getObjectIdFromIndex(TOStoreHnd store,uint32_t objectIndex,TOStoreObjID *id)

{
  int iVar1;
  TOStoreObjID local_44 [2];
  TDskObjIndex header;
  uint32_t i;
  uint32_t offset;
  int retval;
  TOStoreObjID *id_local;
  uint32_t objectIndex_local;
  TOStoreHnd store_local;
  
  if (store == (TOStoreHnd)0x0) {
    __assert_fail("store != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                  ,200,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
  }
  if (id != (TOStoreObjID *)0x0) {
    if (store->numberOfObjects <= objectIndex) {
      __assert_fail("objectIndex < store->numberOfObjects",
                    "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                    ,0xcc,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
    }
    header.numberOfBlocks = 4;
    i = 0xffffffff;
    header.tailBlock = 0;
    while( true ) {
      if (store->numberOfObjects <= header.tailBlock) {
        return i;
      }
      memset(local_44,0,0x10);
      header.numberOfBlocks = header.tailBlock * 0x10 + 4;
      iVar1 = readWithIndex(store,&(store->tableOfObjectsHeader).header,header.numberOfBlocks,0x10,
                            local_44);
      if (iVar1 != 0) break;
      i = 0;
      if (header.tailBlock == objectIndex) {
        *id = local_44[0];
        return 0;
      }
      header.tailBlock = header.tailBlock + 1;
    }
    return iVar1;
  }
  __assert_fail("id != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                ,0xc9,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
}

Assistant:

int ostore_getObjectIdFromIndex(TOStoreHnd store, uint32_t objectIndex, TOStoreObjID* id) {
    assert(store != NULL);
    assert(id != NULL);

    START;
    assert(objectIndex < store->numberOfObjects);
    uint32_t offset = sizeof(uint32_t);

    retval = ERR_NOT_FOUND;
    for(uint32_t i = 0; i < store->numberOfObjects; i++) {
        LOCAL_MEMZ(TDskObjIndex, header);
        offset = (i * sizeof(TDskObjIndex)) + sizeof(uint32_t);
        retval = readWithIndex(store, &store->tableOfObjectsHeader.header, offset, sizeof(TDskObjIndex), &header);
        IF_NOT_OK_HANDLE_ERROR(retval);
        if (i == objectIndex) {
            (*id) = header.id;
            break;
        }
    }

    PROCESS_ERROR;

    FINISH;
}